

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O2

void __thiscall LINAnalyzerSettings::UpdateInterfacesFromSettings(LINAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mInputChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mLINVersion);
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  return;
}

Assistant:

void LINAnalyzerSettings::UpdateInterfacesFromSettings()
{
    mInputChannelInterface->SetChannel( mInputChannel );
    mLINVersionInterface->SetNumber( mLINVersion );
    mBitRateInterface->SetInteger( mBitRate );
}